

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_filename_wal(char *zFilename)

{
  int iVar1;
  char *z;
  char *in_RDI;
  
  z = sqlite3_filename_journal(in_RDI);
  if (z != (char *)0x0) {
    iVar1 = sqlite3Strlen30(z);
    z = z + (iVar1 + 1);
  }
  return z;
}

Assistant:

SQLITE_API const char *sqlite3_filename_wal(const char *zFilename){
#ifdef SQLITE_OMIT_WAL
  return 0;
#else
  zFilename = sqlite3_filename_journal(zFilename);
  if( zFilename ) zFilename += sqlite3Strlen30(zFilename) + 1;
  return zFilename;
#endif
}